

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::unparseChild(QPDFWriter *this,QPDFObjectHandle *child,int level,int flags)

{
  element_type *peVar1;
  bool bVar2;
  Object *pOVar3;
  string_view str;
  string_view str_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      linearized == false) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)child);
    enqueueObject(this,(QPDFObjectHandle *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  }
  bVar2 = QPDFObjectHandle::isIndirect(child);
  if (bVar2) {
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)child);
    pOVar3 = ObjTable<QPDFWriter::Object>::operator[]
                       (&(peVar1->obj).super_ObjTable<QPDFWriter::Object>,
                        (QPDFObjectHandle *)&local_68);
    std::__cxx11::to_string(&local_48,pOVar3->renumber);
    str._M_str = local_48._M_dataplus._M_p;
    str._M_len = local_48._M_string_length;
    writeString(this,str);
    std::__cxx11::string::~string((string *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    str_00._M_str = " 0 R";
    str_00._M_len = 4;
    writeString(this,str_00);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_78,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)child);
    unparseObject(this,(QPDFObjectHandle *)&_Stack_78,level,flags,0,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_78._M_refcount);
  }
  return;
}

Assistant:

void
QPDFWriter::unparseChild(QPDFObjectHandle child, int level, int flags)
{
    if (!m->linearized) {
        enqueueObject(child);
    }
    if (child.isIndirect()) {
        writeString(std::to_string(m->obj[child].renumber));
        writeString(" 0 R");
    } else {
        unparseObject(child, level, flags);
    }
}